

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O2

DdNode * cuddAddExistAbstractRecur(DdManager *manager,DdNode *f,DdNode *cube)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int iVar5;
  
  if (manager->zero == f) {
    return f;
  }
  if ((ulong)cube->index == 0x7fffffff) {
    return f;
  }
  iVar5 = 0x7fffffff;
  if ((ulong)f->index != 0x7fffffff) {
    iVar5 = manager->perm[f->index];
  }
  if (manager->perm[cube->index] < iVar5) {
    pDVar2 = cuddAddExistAbstractRecur(manager,f,(cube->type).kids.T);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = cuddAddApplyRecur(manager,Cudd_addTimes,pDVar2,two);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(manager,pDVar2);
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar3;
    }
  }
  else {
    pDVar2 = cuddCacheLookup2(manager,Cudd_addExistAbstract,f,cube);
    if (pDVar2 != (DdNode *)0x0) {
      return pDVar2;
    }
    pDVar2 = (f->type).kids.T;
    pDVar3 = (f->type).kids.E;
    if (f->index == cube->index) {
      pDVar2 = cuddAddExistAbstractRecur(manager,pDVar2,(cube->type).kids.T);
      if (pDVar2 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = cuddAddExistAbstractRecur(manager,pDVar3,(cube->type).kids.T);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = cuddAddApplyRecur(manager,Cudd_addPlus,pDVar2,pDVar3);
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(manager,pDVar2);
          Cudd_RecursiveDeref(manager,pDVar3);
          cuddCacheInsert2(manager,Cudd_addExistAbstract,f,cube,pDVar4);
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          return pDVar4;
        }
        Cudd_RecursiveDeref(manager,pDVar2);
        pDVar2 = pDVar3;
      }
    }
    else {
      pDVar2 = cuddAddExistAbstractRecur(manager,pDVar2,cube);
      if (pDVar2 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = cuddAddExistAbstractRecur(manager,pDVar3,cube);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = pDVar2;
        if ((pDVar2 == pDVar3) ||
           (pDVar4 = cuddUniqueInter(manager,f->index,pDVar2,pDVar3), pDVar4 != (DdNode *)0x0)) {
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(manager,Cudd_addExistAbstract,f,cube,pDVar4);
          return pDVar4;
        }
        Cudd_RecursiveDeref(manager,pDVar2);
        pDVar2 = pDVar3;
      }
    }
  }
  Cudd_RecursiveDeref(manager,pDVar2);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddAddExistAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *T, *E, *res, *res1, *res2, *zero;

    statLine(manager);
    zero = DD_ZERO(manager);

    /* Cube is guaranteed to be a cube at this point. */        
    if (f == zero || cuddIsConstant(cube)) {  
        return(f);
    }

    /* Abstract a variable that does not appear in f => multiply by 2. */
    if (cuddI(manager,f->index) > cuddI(manager,cube->index)) {
        res1 = cuddAddExistAbstractRecur(manager, f, cuddT(cube));
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        /* Use the "internal" procedure to be alerted in case of
        ** dynamic reordering. If dynamic reordering occurs, we
        ** have to abort the entire abstraction.
        */
        res = cuddAddApplyRecur(manager,Cudd_addTimes,res1,two);
        if (res == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(manager,res1);
        cuddDeref(res);
        return(res);
    }

    if ((res = cuddCacheLookup2(manager, Cudd_addExistAbstract, f, cube)) != NULL) {
        return(res);
    }

    T = cuddT(f);
    E = cuddE(f);

    /* If the two indices are the same, so are their levels. */
    if (f->index == cube->index) {
        res1 = cuddAddExistAbstractRecur(manager, T, cuddT(cube));
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddAddExistAbstractRecur(manager, E, cuddT(cube));
        if (res2 == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = cuddAddApplyRecur(manager, Cudd_addPlus, res1, res2);
        if (res == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            Cudd_RecursiveDeref(manager,res2);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(manager,res1);
        Cudd_RecursiveDeref(manager,res2);
        cuddCacheInsert2(manager, Cudd_addExistAbstract, f, cube, res);
        cuddDeref(res);
        return(res);
    } else { /* if (cuddI(manager,f->index) < cuddI(manager,cube->index)) */
        res1 = cuddAddExistAbstractRecur(manager, T, cube);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddAddExistAbstractRecur(manager, E, cube);
        if (res2 == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = (res1 == res2) ? res1 :
            cuddUniqueInter(manager, (int) f->index, res1, res2);
        if (res == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            Cudd_RecursiveDeref(manager,res2);
            return(NULL);
        }
        cuddDeref(res1);
        cuddDeref(res2);
        cuddCacheInsert2(manager, Cudd_addExistAbstract, f, cube, res);
        return(res);
    }       

}